

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCurl.cxx
# Opt level: O0

optional<int> cmCurlParseTLSVersion(string_view tls_version)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  bool bVar1;
  anon_enum_32 local_fc;
  basic_string_view<char,_std::char_traits<char>_> local_f8;
  size_t local_e8;
  char *local_e0;
  size_t local_d8;
  char *local_d0;
  anon_enum_32 local_c4;
  basic_string_view<char,_std::char_traits<char>_> local_c0;
  size_t local_b0;
  char *local_a8;
  size_t local_a0;
  char *local_98;
  anon_enum_32 local_8c;
  basic_string_view<char,_std::char_traits<char>_> local_88;
  size_t local_78;
  char *local_70;
  size_t local_68;
  char *local_60;
  anon_enum_32 local_54;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  size_t local_40;
  char *local_38;
  size_t local_30;
  char *local_28;
  size_t local_20;
  string_view tls_version_local;
  optional<int> v;
  
  tls_version_local._M_len = (size_t)tls_version._M_str;
  local_20 = tls_version._M_len;
  std::optional<int>::optional((optional<int> *)&tls_version_local._M_str);
  local_30 = local_20;
  local_28 = (char *)tls_version_local._M_len;
  local_50 = (basic_string_view<char,_std::char_traits<char>_>)cm::operator____s("1.0",3);
  local_40 = local_50._M_len;
  local_38 = local_50._M_str;
  __x_02._M_str = local_28;
  __x_02._M_len = local_30;
  bVar1 = std::operator==(__x_02,local_50);
  if (bVar1) {
    local_54 = BT_RSQB;
    std::optional<int>::operator=((optional<int> *)&tls_version_local._M_str,&local_54);
  }
  else {
    local_68 = local_20;
    local_60 = (char *)tls_version_local._M_len;
    local_88 = (basic_string_view<char,_std::char_traits<char>_>)cm::operator____s("1.1",3);
    local_78 = local_88._M_len;
    local_70 = local_88._M_str;
    __x_01._M_str = local_60;
    __x_01._M_len = local_68;
    bVar1 = std::operator==(__x_01,local_88);
    if (bVar1) {
      local_8c = BT_LEAD2;
      std::optional<int>::operator=((optional<int> *)&tls_version_local._M_str,&local_8c);
    }
    else {
      local_a0 = local_20;
      local_98 = (char *)tls_version_local._M_len;
      local_c0 = (basic_string_view<char,_std::char_traits<char>_>)cm::operator____s("1.2",3);
      local_b0 = local_c0._M_len;
      local_a8 = local_c0._M_str;
      __x_00._M_str = local_98;
      __x_00._M_len = local_a0;
      bVar1 = std::operator==(__x_00,local_c0);
      if (bVar1) {
        local_c4 = BT_LEAD3;
        std::optional<int>::operator=((optional<int> *)&tls_version_local._M_str,&local_c4);
      }
      else {
        local_d8 = local_20;
        local_d0 = (char *)tls_version_local._M_len;
        local_f8 = (basic_string_view<char,_std::char_traits<char>_>)cm::operator____s("1.3",3);
        local_e8 = local_f8._M_len;
        local_e0 = local_f8._M_str;
        __x._M_str = local_d0;
        __x._M_len = local_d8;
        bVar1 = std::operator==(__x,local_f8);
        if (bVar1) {
          local_fc = BT_LEAD4;
          std::optional<int>::operator=((optional<int> *)&tls_version_local._M_str,&local_fc);
        }
      }
    }
  }
  return (_Optional_base<int,_true,_true>)(_Optional_base<int,_true,_true>)tls_version_local._M_str;
}

Assistant:

cm::optional<int> cmCurlParseTLSVersion(cm::string_view tls_version)
{
  cm::optional<int> v;
  if (tls_version == "1.0"_s) {
    v = CURL_SSLVERSION_TLSv1_0;
  } else if (tls_version == "1.1"_s) {
    v = CURL_SSLVERSION_TLSv1_1;
  } else if (tls_version == "1.2"_s) {
    v = CURL_SSLVERSION_TLSv1_2;
  } else if (tls_version == "1.3"_s) {
    v = CURL_SSLVERSION_TLSv1_3;
  }
  return v;
}